

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

int sptk::world::anon_unknown_2::ZeroCrossingEngine
              (double *filtered_signal,int y_length,double fs,double *interval_locations,
              double *intervals)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  int i_3;
  int i_2;
  double *fine_edges;
  int i_1;
  int count;
  int *edges;
  int i;
  int *negative_going_points;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_3c;
  undefined4 local_4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ESI;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  for (local_3c = 0; local_3c < in_ESI + -1; local_3c = local_3c + 1) {
    if ((*(double *)(in_RDI + (long)local_3c * 8) <= 0.0) ||
       (0.0 < *(double *)(in_RDI + (long)(local_3c + 1) * 8))) {
      local_64 = 0;
    }
    else {
      local_64 = local_3c + 1;
    }
    *(int *)((long)pvVar5 + (long)local_3c * 4) = local_64;
  }
  *(undefined4 *)((long)pvVar5 + (long)(in_ESI + -1) * 4) = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_ESI;
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar4);
  local_4c = 0;
  for (local_50 = 0; local_50 < in_ESI; local_50 = local_50 + 1) {
    if (0 < *(int *)((long)pvVar5 + (long)local_50 * 4)) {
      *(undefined4 *)((long)pvVar6 + (long)local_4c * 4) =
           *(undefined4 *)((long)pvVar5 + (long)local_50 * 4);
      local_4c = local_4c + 1;
    }
  }
  if (local_4c < 2) {
    if (pvVar6 != (void *)0x0) {
      operator_delete__(pvVar6);
    }
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
    local_4 = 0;
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)local_4c;
    uVar4 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar7 = operator_new__(uVar4);
    for (local_5c = 0; local_5c < local_4c; local_5c = local_5c + 1) {
      *(double *)((long)pvVar7 + (long)local_5c * 8) =
           (double)*(int *)((long)pvVar6 + (long)local_5c * 4) -
           *(double *)(in_RDI + (long)(*(int *)((long)pvVar6 + (long)local_5c * 4) + -1) * 8) /
           (*(double *)(in_RDI + (long)*(int *)((long)pvVar6 + (long)local_5c * 4) * 8) -
           *(double *)(in_RDI + (long)(*(int *)((long)pvVar6 + (long)local_5c * 4) + -1) * 8));
    }
    for (local_60 = 0; local_60 < local_4c + -1; local_60 = local_60 + 1) {
      *(double *)(in_RCX + (long)local_60 * 8) =
           in_XMM0_Qa /
           (*(double *)((long)pvVar7 + (long)(local_60 + 1) * 8) -
           *(double *)((long)pvVar7 + (long)local_60 * 8));
      *(double *)(in_RDX + (long)local_60 * 8) =
           ((*(double *)((long)pvVar7 + (long)local_60 * 8) +
            *(double *)((long)pvVar7 + (long)(local_60 + 1) * 8)) / 2.0) / in_XMM0_Qa;
    }
    if (pvVar7 != (void *)0x0) {
      operator_delete__(pvVar7);
    }
    if (pvVar6 != (void *)0x0) {
      operator_delete__(pvVar6);
    }
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
    local_4 = local_4c + -1;
  }
  return local_4;
}

Assistant:

static int ZeroCrossingEngine(const double *filtered_signal, int y_length,
    double fs, double *interval_locations, double *intervals) {
  int *negative_going_points = new int[y_length];

  for (int i = 0; i < y_length - 1; ++i)
    negative_going_points[i] =
      0.0 < filtered_signal[i] && filtered_signal[i + 1] <= 0.0 ? i + 1 : 0;
  negative_going_points[y_length - 1] = 0;

  int *edges = new int[y_length];
  int count = 0;
  for (int i = 0; i < y_length; ++i)
    if (negative_going_points[i] > 0)
      edges[count++] = negative_going_points[i];

  if (count < 2) {
    delete[] edges;
    delete[] negative_going_points;
    return 0;
  }

  double *fine_edges = new double[count];
  for (int i = 0; i < count; ++i)
    fine_edges[i] = edges[i] - filtered_signal[edges[i] - 1] /
      (filtered_signal[edges[i]] - filtered_signal[edges[i] - 1]);

  for (int i = 0; i < count - 1; ++i) {
    intervals[i] = fs / (fine_edges[i + 1] - fine_edges[i]);
    interval_locations[i] = (fine_edges[i] + fine_edges[i + 1]) / 2.0 / fs;
  }

  delete[] fine_edges;
  delete[] edges;
  delete[] negative_going_points;
  return count - 1;
}